

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DistWeightSyntax::setChild(DistWeightSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  Token TVar2;
  
  if (index == 2) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pSVar1 = (SyntaxNode *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
    }
    (this->expr).ptr = (ExpressionSyntax *)pSVar1;
  }
  else if (index == 1) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->extraOp).kind = TVar2.kind;
    (this->extraOp).field_0x2 = TVar2._2_1_;
    (this->extraOp).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->extraOp).rawLen = TVar2.rawLen;
    (this->extraOp).info = TVar2.info;
  }
  else {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->op).kind = TVar2.kind;
    (this->op).field_0x2 = TVar2._2_1_;
    (this->op).numFlags = (NumericTokenFlags)TVar2.numFlags.raw;
    (this->op).rawLen = TVar2.rawLen;
    (this->op).info = TVar2.info;
  }
  return;
}

Assistant:

void DistWeightSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: op = child.token(); return;
        case 1: extraOp = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}